

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

void kj::_::stripLeadingAndTrailingSpace(ArrayPtr<const_char> *str)

{
  size_t sVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  bool bVar5;
  
  sVar1 = str->size_;
  if (sVar1 == 0) {
    return;
  }
  pcVar4 = str->ptr;
  sVar3 = sVar1;
  pcVar2 = pcVar4;
  while( true ) {
    sVar3 = sVar3 - 1;
    if ((*pcVar2 != ' ') && (*pcVar2 != '\t')) break;
    str->ptr = pcVar2 + 1;
    str->size_ = sVar3;
    pcVar2 = pcVar2 + 1;
    if (sVar3 == 0) {
      return;
    }
  }
  pcVar4 = pcVar4 + sVar1;
  while( true ) {
    pcVar4 = pcVar4 + -1;
    if ((*pcVar4 != ' ') && (*pcVar4 != '\t')) break;
    str->size_ = sVar3;
    bVar5 = sVar3 == 0;
    sVar3 = sVar3 - 1;
    if (bVar5) {
      return;
    }
  }
  return;
}

Assistant:

void stripLeadingAndTrailingSpace(ArrayPtr<const char>& str) {
  // Remove any leading/trailing spaces from `str`, modifying it in-place.
  while (str.size() > 0 && (str[0] == ' ' || str[0] == '\t')) {
    str = str.slice(1, str.size());
  }
  while (str.size() > 0 && (str.back() == ' ' || str.back() == '\t')) {
    str = str.first(str.size() - 1);
  }
}